

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader.c
# Opt level: O1

int32_t ecs_reader_read(char *buffer,int32_t size,ecs_reader_t *reader)

{
  ecs_table_reader_t *reader_00;
  char *__s;
  int32_t i;
  int iVar1;
  int32_t iVar2;
  ecs_blob_header_kind_t eVar3;
  void *pvVar4;
  long lVar5;
  uint uVar6;
  ecs_blob_header_kind_t *__dest;
  uint uVar7;
  int iVar8;
  size_t sVar9;
  int iVar10;
  bool bVar11;
  
  if (size != 0) {
    _ecs_assert(3 < size,2,(char *)0x0,"size >= ECS_SIZEOF(int32_t)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O1/flecs-clone-prefix/src/flecs-clone/src/addons/reader.c"
                ,0x14f);
    if (size < 4) {
      __assert_fail("size >= (ecs_size_t)sizeof(int32_t)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O1/flecs-clone-prefix/src/flecs-clone/src/addons/reader.c"
                    ,0x14f,"int32_t ecs_reader_read(char *, int32_t, ecs_reader_t *)");
    }
    _ecs_assert((size & 3U) == 0,2,(char *)0x0,"size % 4 == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O1/flecs-clone-prefix/src/flecs-clone/src/addons/reader.c"
                ,0x150);
    if ((size & 3U) != 0) {
      __assert_fail("size % 4 == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O1/flecs-clone-prefix/src/flecs-clone/src/addons/reader.c"
                    ,0x150,"int32_t ecs_reader_read(char *, int32_t, ecs_reader_t *)");
    }
    if (reader->state == EcsTableSegment) {
      reader_00 = &reader->table;
      iVar10 = 0;
      do {
        uVar6 = 0;
        if ((size == 0) || (uVar6 = 0xffffffff, size < 4)) goto LAB_00134f6a;
        if (reader_00->state == EcsStreamHeader) {
          next_table(reader,reader_00);
          (reader->table).state = EcsTableHeader;
        }
        eVar3 = reader_00->state;
        if (10 < eVar3 - EcsTableHeader) {
switchD_00134cc2_caseD_7:
          _ecs_abort(0xc,(char *)0x0,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O1/flecs-clone-prefix/src/flecs-clone/src/addons/reader.c"
                     ,0x13c);
          abort();
        }
        __dest = (ecs_blob_header_kind_t *)(buffer + iVar10);
        switch(eVar3) {
        case EcsTableTypeSize:
          eVar3 = ecs_vector_count((reader->table).type);
          break;
        case EcsTableType:
          pvVar4 = _ecs_vector_first((reader->table).type,8,0x10);
          *__dest = *(ecs_blob_header_kind_t *)((long)(reader->table).type_written + (long)pvVar4);
          iVar8 = (reader->table).type_written + 4;
          (reader->table).type_written = iVar8;
          iVar2 = ecs_vector_count((reader->table).type);
          uVar6 = 4;
          bVar11 = iVar8 == iVar2 << 3;
          goto LAB_00134f2b;
        case EcsTableSize:
          eVar3 = ecs_table_count((reader->table).table);
          break;
        case EcsTableColumn:
          goto switchD_00134cc2_caseD_7;
        case EcsTableColumnSize:
          *__dest = (int)(reader->table).column_size;
          ecs_table_reader_next(reader);
          uVar6 = 4;
          bVar11 = (reader->table).column_size == 0;
          goto LAB_00134f2b;
        case EcsTableColumnData:
          iVar1 = (int)(reader->table).column_size * (reader->table).row_count;
          iVar8 = (reader->table).column_written;
          uVar6 = iVar1 - iVar8;
          if (size <= (int)uVar6) {
            uVar6 = size;
          }
          memcpy(__dest,(void *)((long)iVar8 + (long)(reader->table).column_data),(long)(int)uVar6);
          iVar8 = (reader->table).column_written + uVar6;
          (reader->table).column_written = iVar8;
          _ecs_assert(iVar8 <= iVar1,0xc,(char *)0x0,"reader->column_written <= column_bytes",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O1/flecs-clone-prefix/src/flecs-clone/src/addons/reader.c"
                      ,0xf9);
          if (iVar1 < (reader->table).column_written) {
            __assert_fail("reader->column_written <= column_bytes",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O1/flecs-clone-prefix/src/flecs-clone/src/addons/reader.c"
                          ,0xf9,"ecs_size_t ecs_table_reader(char *, ecs_size_t, ecs_reader_t *)");
          }
          uVar7 = uVar6 + 2;
          if (-1 < (int)(uVar6 - 1)) {
            uVar7 = uVar6 - 1;
          }
          uVar7 = (uVar7 & 0xfffffffc) + 4;
          if (uVar7 - uVar6 != 0) {
            memset((void *)((long)__dest + (long)(int)uVar6),0,(long)(int)(uVar7 - uVar6));
            _ecs_assert((int)uVar7 <= size,0xc,(char *)0x0,"read <= size",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O1/flecs-clone-prefix/src/flecs-clone/src/addons/reader.c"
                        ,0x106);
            uVar6 = uVar7;
            if (size < (int)uVar7) {
              __assert_fail("read <= size",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O1/flecs-clone-prefix/src/flecs-clone/src/addons/reader.c"
                            ,0x106,"ecs_size_t ecs_table_reader(char *, ecs_size_t, ecs_reader_t *)"
                           );
            }
          }
          bVar11 = (reader->table).column_written == iVar1;
          goto LAB_00134f2b;
        case EcsTableColumnNameLength:
          __s = *(char **)((long)(reader->table).column_data +
                          (long)(reader->table).row_index * 0x18);
          (reader->table).name = __s;
          sVar9 = strlen(__s);
          eVar3 = (int)sVar9 + EcsTableSegment;
          (reader->table).name_len = eVar3;
          (reader->table).name_written = 0;
          break;
        case EcsTableColumnName:
          lVar5 = (long)(reader->table).name_written;
          sVar9 = (reader->table).name_len - lVar5;
          if ((int)sVar9 < 4) {
            memcpy(__dest,(reader->table).name + lVar5,sVar9);
            memset((void *)((long)__dest + sVar9),0,(ulong)(4 - (int)sVar9));
          }
          else {
            lVar5 = 0;
            do {
              *(char *)((long)__dest + lVar5) =
                   (reader->table).name[lVar5 + (reader->table).name_written];
              lVar5 = lVar5 + 1;
            } while (lVar5 != 4);
            sVar9 = 4;
          }
          iVar8 = (int)sVar9 + (reader->table).name_written;
          (reader->table).name_written = iVar8;
          uVar6 = 4;
          bVar11 = iVar8 == (reader->table).name_len;
LAB_00134f2b:
          if (bVar11) goto LAB_00134f32;
          goto LAB_00134f3a;
        }
        *__dest = eVar3;
        uVar6 = 4;
LAB_00134f32:
        ecs_table_reader_next(reader);
LAB_00134f3a:
        _ecs_assert((uVar6 & 3) == 0,0xc,(char *)0x0,"read % 4 == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O1/flecs-clone-prefix/src/flecs-clone/src/addons/reader.c"
                    ,0x13f);
        if ((uVar6 & 3) != 0) {
          __assert_fail("read % 4 == 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O1/flecs-clone-prefix/src/flecs-clone/src/addons/reader.c"
                        ,0x13f,"ecs_size_t ecs_table_reader(char *, ecs_size_t, ecs_reader_t *)");
        }
LAB_00134f6a:
        if (uVar6 == 0) {
          return iVar10;
        }
        iVar10 = iVar10 + uVar6;
        if (reader->state != EcsTableSegment) {
          return iVar10;
        }
        size = size - uVar6;
        _ecs_assert((size & 3U) == 0,0xc,(char *)0x0,"remaining % 4 == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O1/flecs-clone-prefix/src/flecs-clone/src/addons/reader.c"
                    ,0x15b);
        if ((size & 3U) != 0) {
          __assert_fail("remaining % 4 == 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O1/flecs-clone-prefix/src/flecs-clone/src/addons/reader.c"
                        ,0x15b,"int32_t ecs_reader_read(char *, int32_t, ecs_reader_t *)");
        }
      } while( true );
    }
  }
  return 0;
}

Assistant:

int32_t ecs_reader_read(
    char *buffer,
    int32_t size,
    ecs_reader_t *reader)
{
    int32_t read, total_read = 0, remaining = size;

    if (!size) {
        return 0;
    }

    ecs_assert(size >= ECS_SIZEOF(int32_t), ECS_INVALID_PARAMETER, NULL);
    ecs_assert(size % 4 == 0, ECS_INVALID_PARAMETER, NULL);

    if (reader->state == EcsTableSegment) {
        while ((read = ecs_table_reader(ECS_OFFSET(buffer, total_read), remaining, reader))) {
            remaining -= read;
            total_read += read;

            if (reader->state != EcsTableSegment) {
                break;
            }

            ecs_assert(remaining % 4 == 0, ECS_INTERNAL_ERROR, NULL);        
        }
    }  
    
    return total_read;
}